

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall UdpSocketImpl::UdpSocketImpl(UdpSocketImpl *this,BaseSocket *pBkRef)

{
  BaseSocketImpl::BaseSocketImpl(&this->super_BaseSocketImpl);
  (this->super_BaseSocketImpl)._vptr_BaseSocketImpl = (_func_int **)&PTR__UdpSocketImpl_001465c0;
  memset(&this->m_fnSslDecode,0,0x98);
  std::
  _Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_initialize_map(&(this->m_quInData).
                       super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ,0);
  memset(&this->m_fnSslEncode,0,0x98);
  std::
  _Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_initialize_map(&(this->m_quOutData).
                       super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ,0);
  this->m_bCloseReq = false;
  (this->m_mxWrite).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mxWrite).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mxWrite).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mxWrite).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mxWrite).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->m_cv);
  (this->m_fBytesReceivedParam).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fBytesReceivedParam)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_fBytesReceivedParam).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fBytesReceivedParam).super__Function_base._M_functor + 8) = 0;
  (this->m_fBytesReceived).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fBytesReceived)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_fBytesReceived).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fBytesReceived).super__Function_base._M_functor + 8) = 0;
  (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i = 0;
  (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_BaseSocketImpl).m_pBkRef = pBkRef;
  return;
}

Assistant:

UdpSocketImpl::UdpSocketImpl(BaseSocket* pBkRef) : m_bCloseReq(false)
{
    atomic_init(&m_atInBytes, static_cast<size_t>(0));
    atomic_init(&m_atOutBytes, static_cast<size_t>(0));
    m_pBkRef = pBkRef;
}